

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma2_encode(void *coder_ptr,lzma_mf *mf,uint8_t *out,size_t *out_pos,size_t out_size)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint uVar4;
  lzma_ret lVar5;
  lzma_ret ret;
  uint32_t read_start;
  uint32_t limit;
  uint32_t left;
  lzma_ret ret_;
  lzma_lzma2_coder_conflict *coder;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_mf *mf_local;
  void *coder_ptr_local;
  
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    switch(*coder_ptr) {
    case 0:
      uVar3 = mf_unencoded(mf);
      if (uVar3 == 0) {
        if (mf->action == LZMA_FINISH) {
          sVar2 = *out_pos;
          *out_pos = sVar2 + 1;
          out[sVar2] = '\0';
        }
        return (uint)(mf->action != LZMA_RUN);
      }
      if (((*(byte *)((long)coder_ptr + 0x81) & 1) != 0) &&
         (lVar5 = lzma_lzma_encoder_reset
                            (*(lzma_lzma1_encoder **)((long)coder_ptr + 8),
                             (lzma_options_lzma *)((long)coder_ptr + 0x10)), lVar5 != LZMA_OK)) {
        return lVar5;
      }
      *(undefined8 *)((long)coder_ptr + 0x88) = 0;
      *(undefined8 *)((long)coder_ptr + 0x90) = 0;
      *(undefined4 *)coder_ptr = 1;
    case 1:
      uVar4 = 0x200000 - (int)*(undefined8 *)((long)coder_ptr + 0x88);
      if (uVar4 < mf->match_len_max) {
        ret = LZMA_OK;
      }
      else {
        ret = ((mf->read_pos - mf->read_ahead) + uVar4) - mf->match_len_max;
      }
      uVar3 = mf->read_pos;
      uVar1 = mf->read_ahead;
      lVar5 = lzma_lzma_encode(*(lzma_lzma1_encoder **)((long)coder_ptr + 8),mf,
                               (uint8_t *)((long)coder_ptr + 0xa6),
                               (size_t *)((long)coder_ptr + 0x90),0x10000,ret);
      *(ulong *)((long)coder_ptr + 0x88) =
           (ulong)((mf->read_pos - mf->read_ahead) - (uVar3 - uVar1)) +
           *(long *)((long)coder_ptr + 0x88);
      if (0x10000 < *(ulong *)((long)coder_ptr + 0x90)) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc6,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < *(ulong *)((long)coder_ptr + 0x88)) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,199,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar5 != LZMA_STREAM_END) {
        return LZMA_OK;
      }
      if (*(ulong *)((long)coder_ptr + 0x90) < *(ulong *)((long)coder_ptr + 0x88)) {
        lzma2_header_lzma((lzma_lzma2_coder_conflict *)coder_ptr);
        *(undefined4 *)coder_ptr = 2;
switchD_0022d76b_caseD_2:
        lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xa0),(size_t *)((long)coder_ptr + 0x98),
                    *(size_t *)((long)coder_ptr + 0x90),out,out_pos,out_size);
        if (*(long *)((long)coder_ptr + 0x98) != *(long *)((long)coder_ptr + 0x90)) {
          return LZMA_OK;
        }
        *(undefined4 *)coder_ptr = 0;
      }
      else {
        *(ulong *)((long)coder_ptr + 0x88) =
             (ulong)mf->read_ahead + *(long *)((long)coder_ptr + 0x88);
        if (0x200000 < *(ulong *)((long)coder_ptr + 0x88)) {
          __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0xd2,
                        "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        mf->read_ahead = 0;
        lzma2_header_uncompressed((lzma_lzma2_coder_conflict *)coder_ptr);
        *(undefined1 *)((long)coder_ptr + 0x81) = 1;
        *(undefined4 *)coder_ptr = 3;
      }
      break;
    case 2:
      goto switchD_0022d76b_caseD_2;
    case 3:
      lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xa0),(size_t *)((long)coder_ptr + 0x98),3,out,
                  out_pos,out_size);
      if (*(long *)((long)coder_ptr + 0x98) != 3) {
        return LZMA_OK;
      }
      *(undefined4 *)coder_ptr = 4;
    case 4:
      mf_read(mf,out,out_pos,out_size,(size_t *)((long)coder_ptr + 0x88));
      if (*(long *)((long)coder_ptr + 0x88) != 0) {
        return LZMA_OK;
      }
      *(undefined4 *)coder_ptr = 0;
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_encode(void *coder_ptr, lzma_mf *restrict mf,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size)
{
	lzma_lzma2_coder *restrict coder = coder_ptr;

	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		const uint32_t read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		const lzma_ret ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}